

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiUtil.cpp
# Opt level: O0

bool ImGui::FileSave(char *label,char *btn,char *buf,size_t buf_size,char *title,int filter_num,
                    char **filter_patterns)

{
  bool bVar1;
  char *__src;
  char *in_RDX;
  ImVec2 *in_RSI;
  undefined8 in_RDI;
  size_t unaff_retaddr;
  char *filename;
  char *in_stack_00000010;
  bool ret;
  char *in_stack_00000808;
  char **in_stack_00000810;
  int in_stack_0000081c;
  char *in_stack_00000820;
  char *in_stack_00000828;
  char *in_stack_ffffffffffffffc0;
  ImVec2 local_38;
  byte local_2d;
  
  local_2d = InputText(in_stack_00000010,filename,unaff_retaddr,
                       (ImGuiInputTextFlags)((ulong)in_RDI >> 0x20),(ImGuiInputTextCallback)in_RSI,
                       in_RDX);
  SameLine((float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),SUB84(in_stack_ffffffffffffffc0,0));
  ImVec2::ImVec2(&local_38,0.0,0.0);
  bVar1 = Button(in_stack_ffffffffffffffc0,in_RSI);
  if (bVar1) {
    __src = tinyfd_saveFileDialog
                      (in_stack_00000828,in_stack_00000820,in_stack_0000081c,in_stack_00000810,
                       in_stack_00000808);
    if (__src != (char *)0x0) {
      strcpy(in_RDX,__src);
    }
    local_2d = 1;
  }
  return (bool)(local_2d & 1);
}

Assistant:

bool FileSave(const char *label, const char *btn, char *buf, size_t buf_size, const char *title, int filter_num,
              const char *const *filter_patterns) {
	bool ret = ImGui::InputText(label, buf, buf_size);
	ImGui::SameLine();

	if (ImGui::Button(btn)) {
		const char *filename = tinyfd_saveFileDialog(title, "", filter_num, filter_patterns, nullptr);
		if (filename)
			strcpy(buf, filename);
		ret = true;
	}
	return ret;
}